

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::UntypedMapBase::ClearTableImpl(UntypedMapBase *this,bool reset)

{
  uint uVar1;
  NodeBase **ppNVar2;
  NodeBase *pNVar3;
  pointer pcVar4;
  NodeBase *pNVar5;
  byte bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  MessageLite *pMVar8;
  Nonnull<const_char_*> pcVar9;
  ulong uVar10;
  
  if (this->num_buckets_ == 1) {
    pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                       (1,1,"num_buckets_ != kGlobalEmptyTableSize");
  }
  else {
    pcVar9 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar9 == (Nonnull<const_char_*>)0x0) {
    if (this->arena_ != (Arena *)0x0) goto LAB_00243160;
    bVar6 = (this->type_info_).field_0x3;
    if (bVar6 < 0x50) {
      bVar6 = (this->type_info_).field_0x3 & 0xf;
      if (bVar6 < 5) {
        uVar1 = this->num_buckets_;
        uVar10 = (ulong)this->index_of_first_non_null_;
        if (this->index_of_first_non_null_ < uVar1) {
          ppNVar2 = this->table_;
          do {
            pNVar5 = ppNVar2[uVar10];
            while (pNVar5 != (NodeBase *)0x0) {
              pNVar3 = pNVar5->next;
              operator_delete(pNVar5,(ulong)(this->type_info_).node_size);
              pNVar5 = pNVar3;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar1);
        }
LAB_00243160:
        if (!reset) {
          DeleteTable(this,this->table_,this->num_buckets_);
          return;
        }
        uVar1 = this->num_buckets_;
        if ((ulong)uVar1 != 0) {
          memset(this->table_,0,(ulong)uVar1 << 3);
        }
        this->num_elements_ = 0;
        this->index_of_first_non_null_ = uVar1;
        return;
      }
      if (bVar6 == 5) {
        uVar1 = this->num_buckets_;
        uVar10 = (ulong)this->index_of_first_non_null_;
        if (this->index_of_first_non_null_ < uVar1) {
          ppNVar2 = this->table_;
          do {
            pNVar5 = ppNVar2[uVar10];
            while (pNVar5 != (NodeBase *)0x0) {
              pNVar3 = pNVar5->next;
              if (pNVar5[1].next != pNVar5 + 3) {
                operator_delete(pNVar5[1].next,(ulong)((long)&(pNVar5[3].next)->next + 1));
              }
              operator_delete(pNVar5,(ulong)(this->type_info_).node_size);
              pNVar5 = pNVar3;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar1);
        }
        goto LAB_00243160;
      }
      goto LAB_00243492;
    }
    bVar6 = bVar6 >> 4;
    if (bVar6 != 6) {
      if (bVar6 == 5) {
        bVar6 = (this->type_info_).field_0x3 & 0xf;
        if (bVar6 < 5) {
          uVar1 = this->num_buckets_;
          uVar10 = (ulong)this->index_of_first_non_null_;
          if (this->index_of_first_non_null_ < uVar1) {
            ppNVar2 = this->table_;
            do {
              pNVar5 = ppNVar2[uVar10];
              while (pNVar5 != (NodeBase *)0x0) {
                pNVar3 = pNVar5->next;
                pbVar7 = GetValue<std::__cxx11::string>(this,pNVar5);
                pcVar4 = (pbVar7->_M_dataplus)._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar4 != &pbVar7->field_2) {
                  operator_delete(pcVar4,(pbVar7->field_2)._M_allocated_capacity + 1);
                }
                operator_delete(pNVar5,(ulong)(this->type_info_).node_size);
                pNVar5 = pNVar3;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar1);
          }
          goto LAB_00243160;
        }
        if (bVar6 == 5) {
          uVar1 = this->num_buckets_;
          uVar10 = (ulong)this->index_of_first_non_null_;
          if (this->index_of_first_non_null_ < uVar1) {
            ppNVar2 = this->table_;
            do {
              pNVar5 = ppNVar2[uVar10];
              while (pNVar5 != (NodeBase *)0x0) {
                pNVar3 = pNVar5->next;
                if (pNVar5[1].next != pNVar5 + 3) {
                  operator_delete(pNVar5[1].next,(ulong)((long)&(pNVar5[3].next)->next + 1));
                }
                pbVar7 = GetValue<std::__cxx11::string>(this,pNVar5);
                pcVar4 = (pbVar7->_M_dataplus)._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar4 != &pbVar7->field_2) {
                  operator_delete(pcVar4,(pbVar7->field_2)._M_allocated_capacity + 1);
                }
                operator_delete(pNVar5,(ulong)(this->type_info_).node_size);
                pNVar5 = pNVar3;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar1);
          }
          goto LAB_00243160;
        }
        goto LAB_0024349c;
      }
      goto LAB_0024348d;
    }
    bVar6 = (this->type_info_).field_0x3 & 0xf;
    if (bVar6 < 5) {
      uVar1 = this->num_buckets_;
      uVar10 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar1) {
        ppNVar2 = this->table_;
        do {
          pNVar5 = ppNVar2[uVar10];
          while (pNVar5 != (NodeBase *)0x0) {
            pNVar3 = pNVar5->next;
            pMVar8 = GetValue<google::protobuf::MessageLite>(this,pNVar5);
            MessageLite::DestroyInstance(pMVar8);
            operator_delete(pNVar5,(ulong)(this->type_info_).node_size);
            pNVar5 = pNVar3;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar1);
      }
      goto LAB_00243160;
    }
    if (bVar6 == 5) {
      uVar1 = this->num_buckets_;
      uVar10 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar1) {
        ppNVar2 = this->table_;
        do {
          pNVar5 = ppNVar2[uVar10];
          while (pNVar5 != (NodeBase *)0x0) {
            pNVar3 = pNVar5->next;
            if (pNVar5[1].next != pNVar5 + 3) {
              operator_delete(pNVar5[1].next,(ulong)((long)&(pNVar5[3].next)->next + 1));
            }
            pMVar8 = GetValue<google::protobuf::MessageLite>(this,pNVar5);
            MessageLite::DestroyInstance(pMVar8);
            operator_delete(pNVar5,(ulong)(this->type_info_).node_size);
            pNVar5 = pNVar3;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar1);
      }
      goto LAB_00243160;
    }
  }
  else {
    ClearTableImpl();
LAB_0024348d:
    ClearTableImpl();
LAB_00243492:
    ClearTableImpl();
  }
  ClearTableImpl();
LAB_0024349c:
  ClearTableImpl();
}

Assistant:

void UntypedMapBase::ClearTableImpl(bool reset) {
  ABSL_DCHECK_NE(num_buckets_, kGlobalEmptyTableSize);

  if (arena_ == nullptr) {
    const auto loop = [this](auto destroy_node) {
      NodeBase** table = table_;
      for (map_index_t b = index_of_first_non_null_, end = num_buckets_;
           b < end; ++b) {
        for (NodeBase* node = table[b]; node != nullptr;) {
          NodeBase* next = node->next;
          absl::PrefetchToLocalCacheNta(next);
          destroy_node(node);
          SizedDelete(node, type_info_.node_size);
          node = next;
        }
      }
    };

    const auto dispatch_key = [&](auto value_handler) {
      if (type_info_.key_type_kind() < TypeKind::kString) {
        loop(value_handler);
      } else if (type_info_.key_type_kind() == TypeKind::kString) {
        loop([=](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          value_handler(node);
        });
      } else {
        Unreachable();
      }
    };

    if (type_info_.value_type_kind() < TypeKind::kString) {
      dispatch_key([](NodeBase*) {});
    } else if (type_info_.value_type_kind() == TypeKind::kString) {
      dispatch_key([&](NodeBase* node) {
        GetValue<std::string>(node)->~basic_string();
      });
    } else if (type_info_.value_type_kind() == TypeKind::kMessage) {
      dispatch_key([&](NodeBase* node) {
        GetValue<MessageLite>(node)->DestroyInstance();
      });
    } else {
      Unreachable();
    }
  }

  if (reset) {
    std::fill(table_, table_ + num_buckets_, nullptr);
    num_elements_ = 0;
    index_of_first_non_null_ = num_buckets_;
  } else {
    DeleteTable(table_, num_buckets_);
  }
}